

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_float,_float,_float,_int>
* fmt::v7::make_args_checked<float&,float&,float&,int&,char[33],char>
            (char (*format_str) [33],remove_reference_t<float_&> *args,
            remove_reference_t<float_&> *args_1,remove_reference_t<float_&> *args_2,
            remove_reference_t<int_&> *args_3)

{
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_float,_float,_float,_int>
  *in_RDI;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_float,_float,_float,_int>
  *in_stack_00000030;
  
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_float,_float,_float,_int>
  ::format_arg_store(in_stack_00000030,(float *)format_str,args,args_1,(int *)args_2);
  return in_RDI;
}

Assistant:

inline auto make_args_checked(const S& format_str,
                              const remove_reference_t<Args>&... args)
    -> format_arg_store<buffer_context<Char>, remove_reference_t<Args>...> {
  static_assert(
      detail::count<(
              std::is_base_of<detail::view, remove_reference_t<Args>>::value &&
              std::is_reference<Args>::value)...>() == 0,
      "passing views as lvalues is disallowed");
  detail::check_format_string<Args...>(format_str);
  return {args...};
}